

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O3

parameter * __thiscall
clipp::detail::action_provider<clipp::parameter>::call
          (action_provider<clipp::parameter> *this,simple_action *a)

{
  _Invoker_type p_Var1;
  _Manager_type p_Var2;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type p_Stack_40;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (_Manager_type)0x0;
  p_Var1 = a->_M_invoker;
  p_Var2 = (a->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_58._M_unused._0_8_ = (undefined8)*(undefined8 *)&(a->super__Function_base)._M_functor;
    local_58._8_8_ = *(undefined8 *)((long)&(a->super__Function_base)._M_functor + 8);
    (a->super__Function_base)._M_manager = (_Manager_type)0x0;
    a->_M_invoker = (_Invoker_type)0x0;
    local_48 = p_Var2;
  }
  local_28 = (code *)0x0;
  pcStack_20 = (code *)0x0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  p_Stack_40 = p_Var1;
  local_38._M_unused._M_object = operator_new(0x20);
  *(undefined8 *)local_38._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_38._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_38._M_unused._0_8_ + 0x10) = 0;
  *(_Invoker_type *)((long)local_38._M_unused._0_8_ + 0x18) = p_Var1;
  if (p_Var2 != (_Manager_type)0x0) {
    *(void **)local_38._M_unused._0_8_ = local_58._M_unused._M_object;
    *(undefined8 *)((long)local_38._M_unused._0_8_ + 8) = local_58._8_8_;
    *(_Manager_type *)((long)local_38._M_unused._0_8_ + 0x10) = p_Var2;
    local_48 = (_Manager_type)0x0;
    p_Stack_40 = (_Invoker_type)0x0;
  }
  pcStack_20 = std::
               _Function_handler<void_(const_char_*),_clipp::detail::action_provider<clipp::parameter>::simple_action_adapter>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(const_char_*),_clipp::detail::action_provider<clipp::parameter>::simple_action_adapter>
             ::_M_manager;
  std::vector<std::function<void(char_const*)>,std::allocator<std::function<void(char_const*)>>>::
  emplace_back<std::function<void(char_const*)>>
            ((vector<std::function<void(char_const*)>,std::allocator<std::function<void(char_const*)>>>
              *)this,(function<void_(const_char_*)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return (parameter *)
         &this[-1].blockedActions_.
          super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

Derived&
    call(simple_action a) {
        argActions_.push_back(simple_action_adapter(std::move(a)));
        return *static_cast<Derived*>(this);
    }